

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O2

ostream * std::operator<<(ostream *os,
                         vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                         *v)

{
  pointer paVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  std::operator<<(os,"[");
  lVar3 = 0;
  for (uVar2 = 0;
      paVar1 = (v->
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(v->
                             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)paVar1) / 0x18);
      uVar2 = uVar2 + 1) {
    operator<<(os,(double3 *)((long)paVar1->_M_elems + lVar3));
    if (uVar2 != ((long)(v->
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(v->
                       super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x18 - 1U) {
      std::operator<<(os,", ");
    }
    lVar3 = lVar3 + 0x18;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}